

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

void Gia_ManCleanupRemap(Gia_Man_t *p,Gia_Man_t *pGia)

{
  uint Lit;
  uint Lit_00;
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int i;
  int v;
  
  v = 1;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pGVar3 = Gia_ManObj(p,v);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Lit = pGVar3->Value;
    if (Lit != 0xffffffff) {
      iVar1 = Abc_Lit2Var(Lit);
      pGVar4 = Gia_ManObj(pGia,iVar1);
      Lit_00 = pGVar4->Value;
      uVar2 = 0xffffffff;
      if (Lit_00 != 0xffffffff) {
        iVar1 = Abc_LitIsCompl(Lit);
        uVar2 = Abc_LitNotCond(Lit_00,iVar1);
      }
      pGVar3->Value = uVar2;
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManCleanupRemap( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj, * pObjGia;
    int i, iPrev;
    Gia_ManForEachObj1( p, pObj, i )
    {
        iPrev = Gia_ObjValue(pObj);
        if ( iPrev == ~0 )
            continue;
        pObjGia = Gia_ManObj( pGia, Abc_Lit2Var(iPrev) );
        if ( pObjGia->Value == ~0 )
            Gia_ObjSetValue( pObj, pObjGia->Value ); 
        else
            Gia_ObjSetValue( pObj, Abc_LitNotCond(pObjGia->Value, Abc_LitIsCompl(iPrev)) );
    }
}